

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.cpp
# Opt level: O2

tuple<double,_int> operator()(vector<rc,_std::allocator<rc>_> *r,int r_size,int result)

{
  int iVar1;
  undefined4 in_register_00000034;
  long lVar2;
  int iVar3;
  _Head_base<0UL,_double,_false> _Var4;
  tuple<double,_int> tVar5;
  
  iVar3 = 3;
  if (result < 3) {
    iVar3 = result;
  }
  iVar1 = -1;
  if (-1 < iVar3) {
    iVar1 = iVar3;
  }
  _Var4._M_head_impl = 0.0;
  iVar3 = 0;
  for (lVar2 = 0; (ulong)(iVar1 + 1) << 4 != lVar2; lVar2 = lVar2 + 0x10) {
    _Var4._M_head_impl =
         _Var4._M_head_impl + *(double *)(*(long *)CONCAT44(in_register_00000034,r_size) + lVar2);
    iVar3 = iVar3 + *(int *)(*(long *)CONCAT44(in_register_00000034,r_size) + 0xc + lVar2);
  }
  *(int *)&(r->super__Vector_base<rc,_std::allocator<rc>_>)._M_impl.super__Vector_impl_data._M_start
       = iVar3;
  (r->super__Vector_base<rc,_std::allocator<rc>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)_Var4._M_head_impl;
  tVar5.super__Tuple_impl<0UL,_double,_int>.super__Head_base<0UL,_double,_false>._M_head_impl =
       _Var4._M_head_impl;
  tVar5.super__Tuple_impl<0UL,_double,_int>._0_8_ = r;
  return (tuple<double,_int>)tVar5.super__Tuple_impl<0UL,_double,_int>;
}

Assistant:

std::tuple<double, int>
sum(const R& r, int r_size, int result)
{
    double sumr{ 0 };
    int sumf{ 0 };

    for (int i = 0, e = std::min(r_size - 1, result); i <= e; ++i) {
        sumr += r[i].value;
        sumf += r[i].f;
    }

    return std::make_tuple(sumr, sumf);
}